

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::Execute(VM *this)

{
  bool bVar1;
  reference pvVar2;
  list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *in_RDI;
  VM *in_stack_00000510;
  
  bVar1 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                    ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
                     &(in_RDI->super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>).
                      _M_impl._M_node.super__List_node_base._M_next[4]._M_prev);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    while ((bVar1 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                              ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
                               &(in_RDI->
                                super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>).
                                _M_impl._M_node.super__List_node_base._M_next[4]._M_prev),
           ((bVar1 ^ 0xffU) & 1) != 0 &&
           (pvVar2 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                               (in_RDI), pvVar2->func_->type_ != ValueT_CFunction))) {
      ExecuteFrame(in_stack_00000510);
    }
    return;
  }
  __assert_fail("!state_->calls_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",0x32
                ,"void luna::VM::Execute()");
}

Assistant:

void VM::Execute()
    {
        assert(!state_->calls_.empty());

        while (!state_->calls_.empty())
        {
            // If current stack frame is a frame of a c function,
            // do not continue execute instructions, just return
            if (state_->calls_.back().func_->type_ == ValueT_CFunction)
                return ;
            ExecuteFrame();
        }
    }